

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall Clasp::Solver::clearStopConflict(Solver *this)

{
  pointer pLVar1;
  
  if (((this->conflict_).ebo_.size != 0) &&
     (pLVar1 = (this->conflict_).ebo_.buf, (pLVar1->rep_ ^ 2) < 2)) {
    (this->levels_).root = pLVar1[1].rep_;
    *(uint *)&(this->levels_).field_0x14 =
         *(uint *)&(this->levels_).field_0x14 & 0xc0000000 | pLVar1[2].rep_ & 0x3fffffff;
    (this->assign_).front = pLVar1[3].rep_;
    (this->conflict_).ebo_.size = 0;
  }
  return;
}

Assistant:

bool empty() const { return ebo_.size == 0;  }